

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O2

string * __thiscall
glcts::TestCaseBase::getGLSLExtDirective_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,ExtensionType type,ExtensionName name,
          ExtensionBehavior behavior)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  allocator<char> local_1b9;
  stringstream str;
  ostream local_1a8;
  
  if (type == EXTENSIONTYPE_NONE) {
    type = EXTENSIONTYPE_NONE;
    if ((name == EXTENSIONNAME_GEOMETRY_POINT_SIZE) ||
       (name == EXTENSIONNAME_TESSELLATION_POINT_SIZE)) goto LAB_00cc6f40;
LAB_00cc707d:
    pcVar5 = fixed_sample_locations_values + 1;
    goto LAB_00cc7199;
  }
  if (name == EXTENSIONNAME_SHADER_IMAGE_ATOMIC) {
    type = EXTENSIONTYPE_OES;
  }
LAB_00cc6f40:
  if (name == EXTENSIONNAME_GEOMETRY_POINT_SIZE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,"GL_OES_geometry_point_size",&local_1b9);
    bVar2 = isExtensionSupported(this,(string *)&str);
    std::__cxx11::string::~string((string *)&str);
    if (bVar2) goto LAB_00cc7074;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,"GL_EXT_geometry_point_size",&local_1b9);
    bVar2 = isExtensionSupported(this,(string *)&str);
    std::__cxx11::string::~string((string *)&str);
    if (!bVar2) goto LAB_00cc707d;
    pcVar5 = "GL_OES_geometry_point_size";
LAB_00cc705e:
    pcVar5 = pcVar5 + 7;
    pcVar4 = "EXT_";
  }
  else {
    if (name == EXTENSIONNAME_TESSELLATION_POINT_SIZE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,"GL_OES_tessellation_point_size",&local_1b9);
      bVar2 = isExtensionSupported(this,(string *)&str);
      std::__cxx11::string::~string((string *)&str);
      if (!bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&str,"GL_EXT_tessellation_point_size",&local_1b9);
        bVar2 = isExtensionSupported(this,(string *)&str);
        std::__cxx11::string::~string((string *)&str);
        if (bVar2) {
          pcVar5 = "GL_OES_tessellation_point_size";
          goto LAB_00cc705e;
        }
        goto LAB_00cc707d;
      }
LAB_00cc7074:
      pcVar4 = "OES_";
    }
    else {
      if (type != EXTENSIONTYPE_EXT) {
        if (type != EXTENSIONTYPE_OES) {
          pcVar5 = "#error unknown extension type\n";
          goto LAB_00cc7199;
        }
        goto LAB_00cc7074;
      }
      pcVar4 = "EXT_";
    }
    switch(name) {
    case EXTENSIONNAME_SHADER_IMAGE_ATOMIC:
      pcVar5 = "shader_image_atomic";
      break;
    case EXTENSIONNAME_SHADER_IO_BLOCKS:
      pcVar5 = "shader_io_blocks";
      break;
    case EXTENSIONNAME_GEOMETRY_SHADER:
      pcVar5 = "geometry_shader";
      break;
    case EXTENSIONNAME_GEOMETRY_POINT_SIZE:
      pcVar5 = "geometry_point_size";
      break;
    case EXTENSIONNAME_TESSELLATION_SHADER:
      pcVar5 = "tessellation_shader";
      break;
    case EXTENSIONNAME_TESSELLATION_POINT_SIZE:
      pcVar5 = "tessellation_point_size";
      break;
    case EXTENSIONNAME_TEXTURE_BUFFER:
      pcVar5 = "texture_buffer";
      break;
    case EXTENSIONNAME_TEXTURE_CUBE_MAP_ARRAY:
      pcVar5 = "texture_cube_map_array";
      break;
    case EXTENSIONNAME_GPU_SHADER5:
      pcVar5 = "gpu_shader5";
      break;
    case EXTENSIONNAME_VIEWPORT_ARRAY:
      pcVar5 = "viewport_array";
      break;
    default:
      pcVar5 = "#error unknown extension name\n";
      goto LAB_00cc7199;
    }
  }
  if (behavior < 4) {
    iVar1 = *(int *)(&DAT_01785ba8 + (ulong)behavior * 4);
    std::__cxx11::stringstream::stringstream((stringstream *)&str);
    poVar3 = std::operator<<(&local_1a8,"#extension GL_");
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,pcVar5);
    poVar3 = std::operator<<(poVar3," : ");
    std::operator<<(poVar3,&DAT_01785ba8 + iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&str);
    return __return_storage_ptr__;
  }
  pcVar5 = "#error unknown extension behavior";
LAB_00cc7199:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar5,(allocator<char> *)&str);
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase::getGLSLExtDirective(ExtensionType type, ExtensionName name, ExtensionBehavior behavior)
{
	if (type == EXTENSIONTYPE_NONE && name != EXTENSIONNAME_GEOMETRY_POINT_SIZE &&
		name != EXTENSIONNAME_TESSELLATION_POINT_SIZE)
	{
		return "";
	}

	const char* type_str	 = NULL;
	const char* name_str	 = NULL;
	const char* behavior_str = NULL;

	if (name == EXTENSIONNAME_SHADER_IMAGE_ATOMIC)
	{
		// There is no EXT version of shader_image_atomic; use OES
		type = EXTENSIONTYPE_OES;
	}

	if (name == EXTENSIONNAME_TESSELLATION_POINT_SIZE)
	{
		// there is no core version of tessellation_point_size, use OES or EXT
		if (isExtensionSupported("GL_OES_tessellation_point_size"))
		{
			type = EXTENSIONTYPE_OES;
		}
		else if (isExtensionSupported("GL_EXT_tessellation_point_size"))
		{
			type = EXTENSIONTYPE_EXT;
		}
		else
		{
			return "";
		}
	}

	if (name == EXTENSIONNAME_GEOMETRY_POINT_SIZE)
	{
		// there is no core version of geometry_point_size, use OES or EXT
		if (isExtensionSupported("GL_OES_geometry_point_size"))
		{
			type = EXTENSIONTYPE_OES;
		}
		else if (isExtensionSupported("GL_EXT_geometry_point_size"))
		{
			type = EXTENSIONTYPE_EXT;
		}
		else
		{
			return "";
		}
	}

	switch (type)
	{
	case EXTENSIONTYPE_EXT:
		type_str = "EXT_";
		break;
	case EXTENSIONTYPE_OES:
		type_str = "OES_";
		break;
	default:
		DE_ASSERT(0);
		return "#error unknown extension type\n";
	}

	switch (name)
	{
	case EXTENSIONNAME_SHADER_IMAGE_ATOMIC:
		name_str = "shader_image_atomic";
		break;
	case EXTENSIONNAME_SHADER_IO_BLOCKS:
		name_str = "shader_io_blocks";
		break;
	case EXTENSIONNAME_GEOMETRY_SHADER:
		name_str = "geometry_shader";
		break;
	case EXTENSIONNAME_GEOMETRY_POINT_SIZE:
		name_str = "geometry_point_size";
		break;
	case EXTENSIONNAME_TESSELLATION_SHADER:
		name_str = "tessellation_shader";
		break;
	case EXTENSIONNAME_TESSELLATION_POINT_SIZE:
		name_str = "tessellation_point_size";
		break;
	case EXTENSIONNAME_TEXTURE_BUFFER:
		name_str = "texture_buffer";
		break;
	case EXTENSIONNAME_TEXTURE_CUBE_MAP_ARRAY:
		name_str = "texture_cube_map_array";
		break;
	case EXTENSIONNAME_GPU_SHADER5:
		name_str = "gpu_shader5";
		break;
	case EXTENSIONNAME_VIEWPORT_ARRAY:
		name_str = "viewport_array";
		break;
	default:
		DE_ASSERT(0);
		return "#error unknown extension name\n";
	}

	switch (behavior)
	{
	case EXTENSIONBEHAVIOR_DISABLE:
		behavior_str = "disable";
		break;
	case EXTENSIONBEHAVIOR_WARN:
		behavior_str = "warn";
		break;
	case EXTENSIONBEHAVIOR_ENABLE:
		behavior_str = "enable";
		break;
	case EXTENSIONBEHAVIOR_REQUIRE:
		behavior_str = "require";
		break;
	default:
		DE_ASSERT(0);
		return "#error unknown extension behavior";
	}

	std::stringstream str;
	str << "#extension GL_" << type_str << name_str << " : " << behavior_str;
	return str.str();
}